

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-dump-file.cpp
# Opt level: O2

bool readBytes(FILE *stream,vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  size_t sVar4;
  size_t __n;
  fpos_t pos;
  
  puVar1 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar3 = fgetpos((FILE *)stream,(fpos_t *)&pos);
  if (iVar3 == 0) {
    __n = (long)puVar2 - (long)puVar1;
    sVar4 = fread((value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                  .super__Vector_impl_data._M_start,1,__n,(FILE *)stream);
    if (sVar4 == __n) {
      return true;
    }
    fsetpos((FILE *)stream,(fpos_t *)&pos);
  }
  return false;
}

Assistant:

bool readBytes(FILE* stream, std::vector<uint8_t>& value)
{
	size_t len = value.size();
	fpos_t pos;
	if (fgetpos(stream, &pos) != 0)
	{
		return false;
	}
	if (fread(&value[0], 1, len, stream) != len)
	{
		(void) fsetpos(stream, &pos);
		return false;
	}
	return true;
}